

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.cc
# Opt level: O3

unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> __thiscall
draco::CornerTable::Create
          (CornerTable *this,
          IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
          *faces)

{
  bool bVar1;
  _Head_base<0UL,_draco::CornerTable_*,_false> this_00;
  unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> ct;
  unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> local_20;
  
  this_00._M_head_impl = (CornerTable *)operator_new(0xa8);
  (((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
     *)((long)this_00._M_head_impl + 0x58))->vector_).
  super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)((long)this_00._M_head_impl + 0x60) = (pointer)0x0;
  *(pointer *)((long)this_00._M_head_impl + 0x68) = (pointer)0x0;
  *(undefined8 *)this_00._M_head_impl = 0;
  *(pointer *)((long)this_00._M_head_impl + 8) = (pointer)0x0;
  *(pointer *)((long)this_00._M_head_impl + 0x10) = (pointer)0x0;
  (((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
     *)((long)this_00._M_head_impl + 0x18))->vector_).
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)((long)this_00._M_head_impl + 0x20) = (pointer)0x0;
  *(pointer *)((long)this_00._M_head_impl + 0x28) = (pointer)0x0;
  (((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
     *)((long)this_00._M_head_impl + 0x30))->vector_).
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)((long)this_00._M_head_impl + 0x38) = (pointer)0x0;
  *(pointer *)((long)this_00._M_head_impl + 0x40) = (pointer)0x0;
  *(undefined8 *)((long)this_00._M_head_impl + 0x48) = 0;
  *(int *)((long)this_00._M_head_impl + 0x50) = 0;
  ((ValenceCache<draco::CornerTable> *)((long)this_00._M_head_impl + 0x70))->table_ =
       this_00._M_head_impl;
  (((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_signed_char> *)
   ((long)this_00._M_head_impl + 0x78))->vector_).
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  *(pointer *)((long)this_00._M_head_impl + 0x80) = (pointer)0x0;
  *(pointer *)((long)this_00._M_head_impl + 0x88) = (pointer)0x0;
  (((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int> *)
   ((long)this_00._M_head_impl + 0x90))->vector_).super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)((long)this_00._M_head_impl + 0x98) = (pointer)0x0;
  *(pointer *)((long)this_00._M_head_impl + 0xa0) = (pointer)0x0;
  local_20._M_t.super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
  _M_t.super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
  super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl =
       (__uniq_ptr_data<draco::CornerTable,_std::default_delete<draco::CornerTable>,_true,_true>)
       (__uniq_ptr_data<draco::CornerTable,_std::default_delete<draco::CornerTable>,_true,_true>)
       this_00._M_head_impl;
  bVar1 = Init(this_00._M_head_impl,faces);
  if (bVar1) {
    local_20._M_t.
    super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>._M_t.
    super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
    super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl =
         (__uniq_ptr_data<draco::CornerTable,_std::default_delete<draco::CornerTable>,_true,_true>)
         (__uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>)0x0;
  }
  else {
    this_00._M_head_impl = (CornerTable *)0x0;
  }
  (this->corner_to_vertex_map_).vector_.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00._M_head_impl;
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::~unique_ptr
            (&local_20);
  return (__uniq_ptr_data<draco::CornerTable,_std::default_delete<draco::CornerTable>,_true,_true>)
         (__uniq_ptr_data<draco::CornerTable,_std::default_delete<draco::CornerTable>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CornerTable> CornerTable::Create(
    const IndexTypeVector<FaceIndex, FaceType> &faces) {
  std::unique_ptr<CornerTable> ct(new CornerTable());
  if (!ct->Init(faces)) {
    return nullptr;
  }
  return ct;
}